

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OffsetTable.cpp
# Opt level: O0

JSONNode __thiscall ser::OffsetTable::TableToJSON(OffsetTable *this)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  pointer ppVar4;
  vector<ser::Savepoint,_std::allocator<ser::Savepoint>_> *in_RSI;
  allocator local_109;
  json_string local_108;
  JSONNode local_e8;
  allocator local_d9;
  json_string local_d8;
  JSONNode local_b8;
  JSONNode local_b0;
  JSONNode valueNode;
  _Self local_a0;
  const_iterator iter;
  OffsetTableEntry *entry;
  json_string local_88;
  JSONNode local_68;
  JSONNode offsetsnode;
  JSONNode entrynode;
  uint savepointID;
  allocator local_41;
  json_string local_40;
  undefined1 local_19;
  OffsetTable *this_local;
  JSONNode *node;
  
  local_19 = 0;
  this_local = this;
  ::JSONNode::JSONNode((JSONNode *)this,'\x04');
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"OffsetTable",&local_41);
  ::JSONNode::set_name((JSONNode *)this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  for (entrynode.internal._0_4_ = 0;
      sVar2 = std::vector<ser::Savepoint,_std::allocator<ser::Savepoint>_>::size(in_RSI),
      (uint)entrynode.internal < sVar2; entrynode.internal._0_4_ = (uint)entrynode.internal + 1) {
    pvVar3 = std::vector<ser::Savepoint,_std::allocator<ser::Savepoint>_>::operator[]
                       (in_RSI,(ulong)(uint)entrynode.internal);
    Savepoint::ToJSON((Savepoint *)&offsetsnode,(int)pvVar3);
    ::JSONNode::JSONNode(&local_68,'\x05');
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_88,"__offsets",(allocator *)((long)&entry + 7));
    ::JSONNode::set_name(&local_68,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)((long)&entry + 7));
    iter._M_node = (_Base_ptr)
                   std::
                   vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
                   ::operator[]((vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
                                 *)(in_RSI + 1),(ulong)(uint)entrynode.internal);
    local_a0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>
                  *)iter._M_node);
    while( true ) {
      valueNode.internal =
           (internalJSONNode *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>
                  *)iter._M_node);
      bVar1 = std::operator!=(&local_a0,(_Self *)&valueNode);
      if (!bVar1) break;
      ::JSONNode::JSONNode(&local_b0,'\x04');
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>
               ::operator->(&local_a0);
      ::JSONNode::set_name(&local_b0,&ppVar4->first);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_d8,"",&local_d9);
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>
               ::operator->(&local_a0);
      ::JSONNode::JSONNode(&local_b8,&local_d8,(ppVar4->second).offset);
      ::JSONNode::push_back(&local_b0,&local_b8);
      ::JSONNode::~JSONNode(&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_108,"",&local_109);
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>
               ::operator->(&local_a0);
      ::JSONNode::JSONNode(&local_e8,&local_108,&(ppVar4->second).checksum);
      ::JSONNode::push_back(&local_b0,&local_e8);
      ::JSONNode::~JSONNode(&local_e8);
      std::__cxx11::string::~string((string *)&local_108);
      std::allocator<char>::~allocator((allocator<char> *)&local_109);
      ::JSONNode::push_back(&local_68,&local_b0);
      ::JSONNode::~JSONNode(&local_b0);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>
      ::operator++(&local_a0);
    }
    ::JSONNode::push_back(&offsetsnode,&local_68);
    ::JSONNode::push_back((JSONNode *)this,&offsetsnode);
    ::JSONNode::~JSONNode(&local_68);
    ::JSONNode::~JSONNode(&offsetsnode);
  }
  return (JSONNode)(internalJSONNode *)this;
}

Assistant:

JSONNode OffsetTable::TableToJSON() const
{
    JSONNode node(JSON_ARRAY);
    node.set_name("OffsetTable");
    for (unsigned savepointID = 0; savepointID < savepoints_.size(); ++savepointID)
    {
        JSONNode entrynode = savepoints_[savepointID].ToJSON(savepointID);
        JSONNode offsetsnode;
        offsetsnode.set_name("__offsets");

        const OffsetTableEntry& entry = entries_[savepointID];
        for (const_iterator iter = entry.begin(); iter != entry.end(); ++iter)
        {
            JSONNode valueNode(JSON_ARRAY);
            valueNode.set_name(iter->first);
            valueNode.push_back(JSONNode("", iter->second.offset));
            valueNode.push_back(JSONNode("", iter->second.checksum));
            offsetsnode.push_back(valueNode);
        }

        entrynode.push_back(offsetsnode);

        node.push_back(entrynode);
    }

    return node;
}